

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# domain.cpp
# Opt level: O3

bool __thiscall RangeSize::propagate(RangeSize *this)

{
  IntVar *pIVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  IntVar *pIVar6;
  long lVar7;
  
  pIVar6 = this->y;
  if ((pIVar6->min).v < 1) {
    if (so.lazy) {
      iVar3 = (*(pIVar6->super_Var).super_Branching._vptr_Branching[8])();
      lVar7 = (long)iVar3 * 4 + 2;
      pIVar6 = this->y;
    }
    else {
      lVar7 = 0;
    }
    iVar3 = (*(pIVar6->super_Var).super_Branching._vptr_Branching[0xe])(pIVar6,1,lVar7,1);
    if ((char)iVar3 != '\0') {
      pIVar6 = this->y;
      goto LAB_001afbf0;
    }
LAB_001afc5c:
    bVar2 = false;
  }
  else {
LAB_001afbf0:
    pIVar1 = this->x;
    lVar7 = ((long)(pIVar1->max).v - (long)(pIVar1->min).v) + 1;
    if ((int)lVar7 < (pIVar6->max).v) {
      if (so.lazy == true) {
        iVar3 = (*(pIVar1->super_Var).super_Branching._vptr_Branching[8])(pIVar1);
        uVar4 = (*(this->x->super_Var).super_Branching._vptr_Branching[9])();
        uVar5 = (ulong)uVar4 << 0x20 | (long)iVar3 << 2 | 3;
        pIVar6 = this->y;
      }
      else {
        uVar5 = 0;
      }
      iVar3 = (*(pIVar6->super_Var).super_Branching._vptr_Branching[0xf])(pIVar6,lVar7,uVar5,1);
      if ((char)iVar3 == '\0') goto LAB_001afc5c;
    }
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool propagate() override {
		if (y->getMin() < 1) {
			setDom((*y), setMin, 1, y->getMinLit());
		}
		setDom((*y), setMax, x->getMax() - x->getMin() + 1, x->getMinLit(), x->getMaxLit());
		return true;
	}